

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O1

void __thiscall Debugger::EnterDebugMode(Debugger *this)

{
  bool bVar1;
  _Elt_pointer psVar2;
  _Elt_pointer psVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar5;
  EmmyFacade *this_01;
  unique_lock<std::mutex> lockEval;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_90;
  shared_ptr<EvalContext> local_80;
  shared_ptr<EvalContext> local_70;
  unique_lock *local_60;
  queue<std::shared_ptr<EvalContext>,_std::deque<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>_>
  *local_58;
  mutex *local_50;
  _Elt_pointer local_48;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->runMtx;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  this->blocking = true;
  local_50 = &this->evalMtx;
  local_58 = &this->evalQueue;
  local_60 = (unique_lock *)&this->cvRun;
  do {
    local_90._M_device = local_50;
    local_90._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_90);
    local_90._M_owns = true;
    if (((this->evalQueue).c.
         super__Deque_base<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
         (this->evalQueue).c.
         super__Deque_base<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) && (this->blocking == true)) {
      std::unique_lock<std::mutex>::unlock(&local_90);
      std::condition_variable::wait(local_60);
      std::unique_lock<std::mutex>::lock(&local_90);
    }
    psVar2 = (this->evalQueue).c.
             super__Deque_base<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    psVar3 = (this->evalQueue).c.
             super__Deque_base<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (psVar3 == psVar2) {
      std::unique_lock<std::mutex>::~unique_lock(&local_90);
      break;
    }
    peVar4 = (psVar2->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (psVar2->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_48 = psVar3;
    std::deque<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>::
    pop_front(&local_58->c);
    std::unique_lock<std::mutex>::unlock(&local_90);
    bVar1 = this->skipHook;
    this->skipHook = true;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_70.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    local_70.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00
    ;
    bVar5 = DoEval(this,&local_70);
    peVar4->success = bVar5;
    if (local_70.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    this->skipHook = bVar1;
    this_01 = EmmyFacade::Get();
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_80.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    local_80.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00
    ;
    EmmyFacade::OnEvalResult(this_01,&local_80);
    if (local_80.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_90);
  } while (local_48 != psVar2);
  ClearCache(this);
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void Debugger::EnterDebugMode() {
	std::unique_lock<std::mutex> lock(runMtx);

	blocking = true;
	while (true) {
		std::unique_lock<std::mutex> lockEval(evalMtx);
		if (evalQueue.empty() && blocking) {
			lockEval.unlock();
			cvRun.wait(lock);
			lockEval.lock();
		}
		if (!evalQueue.empty()) {
			const auto evalContext = evalQueue.front();
			evalQueue.pop();
			lockEval.unlock();
			const bool skip = skipHook;
			skipHook = true;
			evalContext->success = DoEval(evalContext);
			skipHook = skip;
			EmmyFacade::Get().OnEvalResult(evalContext);
			continue;
		}
		break;
	}
	ClearCache();
}